

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

int __thiscall
QFusionStyle::styleHint
          (QFusionStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  QRect *pQVar1;
  QStyleHintReturn *this_00;
  QStyleHintReturn QVar2;
  uint uVar3;
  int iVar4;
  QStyleOption *pQVar5;
  undefined8 *puVar6;
  uint uVar7;
  QStyleHintReturn *pQVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRegion QStack_48;
  QStyleHintReturn local_40;
  Representation local_38;
  Representation local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  if ((int)hint < 0x3c) {
    switch(hint) {
    case SH_EtchDisabledText:
    case SH_MainWindow_SpaceBelowMenuBar:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_ScrollView_FrameOnlyAroundContents:
    case SH_ToolBox_SelectedPageTitleBold:
    case SH_RubberBand_Mask:
switchD_003c21d4_caseD_0:
      uVar3 = 0;
      break;
    default:
switchD_003c21d4_caseD_1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        iVar4 = QCommonStyle::styleHint(&this->super_QCommonStyle,hint,option,widget,returnData);
        return iVar4;
      }
      goto LAB_003c258c;
    case SH_ScrollBar_MiddleClickAbsolutePosition:
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_MenuBar_AltKeyNavigation:
    case SH_ComboBox_ListMouseTracking:
    case SH_Menu_MouseTracking:
    case SH_MenuBar_MouseTracking:
    case SH_ItemView_ChangeHighlightOnFocus:
    case SH_TitleBar_NoBorder:
    case SH_Slider_StopMouseOverSlider:
    case SH_TitleBar_AutoRaise:
      break;
    case SH_Menu_SubMenuPopupDelay:
      uVar3 = 0xe1;
      break;
    case SH_ComboBox_Popup:
      if (((option == (QStyleOption *)0x0) || (option->version < 1)) || (option->type != 0xf0004)) {
        option = (QStyleOption *)0x0;
      }
      if (option == (QStyleOption *)0x0) goto switchD_003c21d4_caseD_0;
      uVar3 = (byte)option[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i ^ 1;
      break;
    case SH_GroupBox_TextLabelVerticalAlignment:
      if (((option == (QStyleOption *)0x0) || (option->version < 1)) ||
         (pQVar5 = option, option->type != 0xf0006)) {
        pQVar5 = (QStyleOption *)0x0;
      }
      if (pQVar5 != (QStyleOption *)0x0) {
        uVar7 = *(uint *)&pQVar5[1].palette.d & 0x1e0;
        uVar3 = 0x20;
        if (uVar7 != 0) {
          uVar3 = uVar7;
        }
      }
      if (pQVar5 == (QStyleOption *)0x0) goto switchD_003c21d4_caseD_1;
      break;
    case SH_Table_GridLineColor:
      if (option == (QStyleOption *)0x0) goto switchD_003c21d4_caseD_0;
      puVar6 = (undefined8 *)QPalette::brush((int)option + 0x28,Dark);
      auVar9 = QColor::darker((int)*puVar6 + 8);
      local_40 = auVar9._0_8_;
      local_38.m_i = auVar9._8_4_;
      local_34.m_i._0_2_ = auVar9._12_2_;
      uVar3 = QColor::rgba();
      break;
    case SH_WindowFrame_Mask:
      if (((returnData == (QStyleHintReturn *)0x0) || (1 < returnData->version)) ||
         (pQVar8 = returnData, returnData->type != 0xf001)) {
        pQVar8 = (QStyleHintReturn *)0x0;
      }
      if (pQVar8 == (QStyleHintReturn *)0x0) goto switchD_003c21d4_caseD_1;
      QRegion::QRegion((QRegion *)&local_40,&option->rect,Rectangle);
      this_00 = pQVar8 + 1;
      QVar2 = pQVar8[1];
      pQVar8[1] = local_40;
      local_40 = QVar2;
      QRegion::~QRegion((QRegion *)&local_40);
      pQVar1 = &option->rect;
      local_34.m_i = (option->rect).y1.m_i;
      local_40.version = (pQVar1->x1).m_i;
      local_40.type = (pQVar1->y1).m_i;
      local_38.m_i = (pQVar1->x1).m_i + 4;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_40.version = (option->rect).x1.m_i;
      local_34.m_i = (option->rect).y1.m_i + 1;
      local_40.type = local_34.m_i;
      local_38.m_i = local_40.version + 2;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_40.version = (option->rect).x1.m_i;
      local_34.m_i = (option->rect).y1.m_i + 2;
      local_40.type = local_34.m_i;
      local_38.m_i = local_40.version + 1;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_38.m_i = (option->rect).x1.m_i;
      iVar4 = (option->rect).y1.m_i;
      local_40.type = iVar4 + 3;
      local_40.version = local_38.m_i;
      local_34.m_i = iVar4 + 4;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_34.m_i = (option->rect).y1.m_i;
      local_38.m_i = (option->rect).x2.m_i;
      local_40.type = local_34.m_i;
      local_40.version = local_38.m_i + -4;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_38.m_i = (option->rect).x2.m_i;
      local_34.m_i = (option->rect).y1.m_i + 1;
      local_40.type = local_34.m_i;
      local_40.version = local_38.m_i + -2;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      local_38.m_i = (option->rect).x2.m_i;
      local_34.m_i = (option->rect).y1.m_i + 2;
      local_40.type = local_34.m_i;
      local_40.version = local_38.m_i + -1;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
      iVar4 = (option->rect).y1.m_i;
      local_38.m_i = (option->rect).x2.m_i;
      local_40.type = iVar4 + 3;
      local_40.version = local_38.m_i;
      local_34.m_i = iVar4 + 4;
      QRegion::QRegion(&QStack_48,(QRect *)&local_40,Rectangle);
      QRegion::operator-=((QRegion *)this_00,&QStack_48);
      QRegion::~QRegion(&QStack_48);
    }
  }
  else {
    switch(hint) {
    case SH_MessageBox_TextInteractionFlags:
      uVar3 = 5;
      break;
    case SH_DialogButtonBox_ButtonsHaveIcons:
    case SH_Menu_SelectionWrap:
    case SH_ItemView_MovementWithoutUpdatingSelection:
    case SH_ToolTip_Mask:
    case SH_FocusFrame_AboveWidget:
    case SH_TextControl_FocusIndicatorTextCharFormat:
      goto switchD_003c21d4_caseD_1;
    case SH_MessageBox_CenterButtons:
    case SH_WizardStyle:
      goto switchD_003c21d4_caseD_0;
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
      break;
    default:
      if ((hint != SH_ItemView_ShowDecorationSelected) && (hint != SH_Menu_SupportsSections))
      goto switchD_003c21d4_caseD_1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar3;
  }
LAB_003c258c:
  __stack_chk_fail();
}

Assistant:

int QFusionStyle::styleHint(StyleHint hint, const QStyleOption *option, const QWidget *widget,
                            QStyleHintReturn *returnData) const
{
    switch (hint) {
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_MenuBar_AltKeyNavigation:
    case SH_ComboBox_ListMouseTracking:
    case SH_Slider_StopMouseOverSlider:
    case SH_ScrollBar_MiddleClickAbsolutePosition:
    case SH_TitleBar_AutoRaise:
    case SH_TitleBar_NoBorder:
    case SH_ItemView_ShowDecorationSelected:
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
    case SH_ItemView_ChangeHighlightOnFocus:
    case SH_MenuBar_MouseTracking:
    case SH_Menu_MouseTracking:
    case SH_Menu_SupportsSections:
        return 1;

#if defined(QT_PLATFORM_UIKIT)
    case SH_ComboBox_UseNativePopup:
        return 1;
#endif

    case SH_EtchDisabledText:
    case SH_ToolBox_SelectedPageTitleBold:
    case SH_ScrollView_FrameOnlyAroundContents:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_MainWindow_SpaceBelowMenuBar:
    case SH_MessageBox_CenterButtons:
    case SH_RubberBand_Mask:
        return 0;

    case SH_ComboBox_Popup:
        if (const QStyleOptionComboBox *cmb = qstyleoption_cast<const QStyleOptionComboBox *>(option))
            return !cmb->editable;
        return 0;

    case SH_Table_GridLineColor:
        return option ? option->palette.window().color().darker(120).rgba() : 0;

    case SH_MessageBox_TextInteractionFlags:
        return Qt::TextSelectableByMouse | Qt::LinksAccessibleByMouse;
#if QT_CONFIG(wizard)
    case SH_WizardStyle:
        return QWizard::ClassicStyle;
#endif
    case SH_Menu_SubMenuPopupDelay:
        return 225; // default from GtkMenu

    case SH_WindowFrame_Mask:
        if (QStyleHintReturnMask *mask = qstyleoption_cast<QStyleHintReturnMask *>(returnData)) {
            //left rounded corner
            mask->region = option->rect;
            mask->region -= QRect(option->rect.left(), option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 3, 1, 2);

            //right rounded corner
            mask->region -= QRect(option->rect.right() - 4, option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.right() - 2, option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.right() - 1, option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.right() , option->rect.top() + 3, 1, 2);
            return 1;
        }
        break;
    case SH_GroupBox_TextLabelVerticalAlignment: {
        if (const auto *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            if (groupBox) {
                const auto vAlign = groupBox->textAlignment & Qt::AlignVertical_Mask;
                // default fusion style is AlignTop
                return vAlign == 0 ? Qt::AlignTop : vAlign;
            }
        }
        break;
    }
    default:
        break;
    }
    return QCommonStyle::styleHint(hint, option, widget, returnData);
}